

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.h
# Opt level: O3

bool __thiscall QDeadlineTimer::hasExpired(QDeadlineTimer *this)

{
  long lVar1;
  
  if (this->t1 != 0x7fffffffffffffff) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    return this->t1 <= lVar1;
  }
  return false;
}

Assistant:

constexpr bool isForever() const noexcept
    { return t1 == (std::numeric_limits<qint64>::max)(); }